

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraohRandomWalk_SRW.h
# Opt level: O1

Estimates * SRW1(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  size_type __n;
  size_type __n_00;
  EdgeIdx *pEVar1;
  Parameters params_00;
  long lVar2;
  uint uVar3;
  void *v1;
  result_type rVar4;
  void *pvVar5;
  ulong uVar6;
  ulong *puVar7;
  size_t __i;
  long lVar8;
  unsigned_long uVar9;
  ulong uVar10;
  long lVar11;
  unsigned_long uVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  unsigned_long uVar18;
  double dVar19;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  uniform_int_distribution<long> dist_parent_nbor;
  uniform_int_distribution<long> dist_parent;
  OrderedEdgeCollection randomEdgeCollection;
  mt19937 mt;
  random_device rd;
  undefined8 in_stack_ffffffffffffc318;
  double dVar20;
  unsigned_long in_stack_ffffffffffffc328;
  double dVar21;
  pointer pOVar22;
  iterator __position;
  OrderedEdge *pOVar23;
  void *pvVar24;
  ulong *in_stack_ffffffffffffc358;
  uint in_stack_ffffffffffffc360;
  undefined4 in_stack_ffffffffffffc364;
  ulong *in_stack_ffffffffffffc368;
  uint in_stack_ffffffffffffc370;
  undefined4 in_stack_ffffffffffffc374;
  _Bit_pointer in_stack_ffffffffffffc378;
  ulong *in_stack_ffffffffffffc380;
  uint in_stack_ffffffffffffc388;
  undefined4 in_stack_ffffffffffffc38c;
  ulong *in_stack_ffffffffffffc390;
  uint in_stack_ffffffffffffc398;
  undefined4 in_stack_ffffffffffffc39c;
  _Bit_pointer in_stack_ffffffffffffc3a0;
  unsigned_long uVar25;
  Parameters *pPVar26;
  Estimates *pEVar27;
  Estimates local_3c18;
  OrderedEdgeCollection local_3bf8;
  uniform_int_distribution<long> local_3b80;
  Parameters local_3b70;
  undefined1 local_3ac8 [16];
  ulong local_3ab8;
  unsigned_long uStack_3ab0;
  vector<bool,_std::allocator<bool>_> local_3aa8;
  vector<bool,_std::allocator<bool>_> local_3a80;
  unsigned_long local_3a58;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  __n = cg->nVertices;
  __n_00 = cg->nEdges;
  pvVar24 = (void *)params->walk_length;
  v1 = (void *)*(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar8 = 1;
  uVar17 = local_2740._M_x[0];
  do {
    uVar17 = (ulong)(((uint)(uVar17 >> 0x1e) ^ (uint)uVar17) * 0x6c078965 + (int)lVar8);
    local_2740._M_x[lVar8] = uVar17;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2740._M_p = 0x270;
  pOVar22 = (pointer)0x0;
  __position._M_current = (OrderedEdge *)0x0;
  pOVar23 = (OrderedEdge *)0x0;
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc380,__n,(bool *)local_3ac8,
             (allocator_type *)&stack0xffffffffffffc358);
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc358,__n_00,
             (bool *)local_3ac8,(allocator_type *)&local_3c18);
  if (cg->offsets[(long)v1 + 1] == cg->offsets[(long)v1]) {
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_3ac8,&local_2740,5000);
    local_3c18.fraction_of_vertices_seen = (double)(cg->nVertices + -1);
    local_3c18.estimate = 0.0;
    uVar17 = 0;
    do {
      printf("BAd luck! Trying again %d\n",uVar17);
      v1 = (void *)std::uniform_int_distribution<long>::operator()
                             ((uniform_int_distribution<long> *)&local_3c18,
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_3ac8,(param_type *)&local_3c18);
      if (0x3e6 < (uint)uVar17) break;
      uVar17 = (ulong)((uint)uVar17 + 1);
    } while (cg->offsets[(long)v1 + 1] == cg->offsets[(long)v1]);
  }
  pEVar1 = cg->offsets;
  uVar12 = pEVar1[(long)v1 + 1] - pEVar1[(long)v1];
  local_3b80._M_param._M_b = uVar12 - 1;
  local_3b80._M_param._M_a = 0;
  lVar8 = pEVar1[(long)v1];
  rVar4 = std::uniform_int_distribution<long>::operator()
                    (&local_3b80,&local_2740,&local_3b80._M_param);
  uVar17 = rVar4 + lVar8;
  pvVar16 = (void *)cg->nbors[uVar17];
  uVar18 = cg->offsets[(long)pvVar16 + 1] - cg->offsets[(long)pvVar16];
  local_3ac8._0_8_ = v1;
  local_3ac8._8_8_ = pvVar16;
  local_3ab8 = uVar17;
  uStack_3ab0 = uVar12;
  if (__position._M_current == pOVar23) {
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338,
               __position,(OrderedEdge *)local_3ac8);
  }
  else {
    (__position._M_current)->index = uVar17;
    (__position._M_current)->degree = uVar12;
    (__position._M_current)->u = (VertexIdx)v1;
    (__position._M_current)->v = (VertexIdx)pvVar16;
    __position._M_current = __position._M_current + 1;
  }
  pvVar13 = (void *)((long)v1 + 0x3f);
  if (-1 < (long)v1) {
    pvVar13 = v1;
  }
  in_stack_ffffffffffffc380
  [((long)pvVar13 >> 6) + ((ulong)(((ulong)v1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       in_stack_ffffffffffffc380
       [((long)pvVar13 >> 6) + ((ulong)(((ulong)v1 & 0x800000000000003f) < 0x8000000000000001) - 1)]
       | 1L << ((byte)v1 & 0x3f);
  pvVar13 = (void *)((long)pvVar16 + 0x3f);
  if (-1 < (long)pvVar16) {
    pvVar13 = pvVar16;
  }
  in_stack_ffffffffffffc380
  [((long)pvVar13 >> 6) + ((ulong)(((ulong)pvVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)]
       = in_stack_ffffffffffffc380
         [((long)pvVar13 >> 6) +
          ((ulong)(((ulong)pvVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << ((byte)pvVar16 & 0x3f);
  lVar8 = 1;
  uVar6 = uVar17 + 0x3f;
  if (-1 < (long)uVar17) {
    uVar6 = uVar17;
  }
  iVar14 = (int)uVar17;
  in_stack_ffffffffffffc358
  [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       in_stack_ffffffffffffc358
       [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar17 & 0x3f);
  if ((long)pvVar24 < 1) {
    dVar21 = 100.0;
    dVar20 = 0.0;
  }
  else {
    dVar20 = 0.0;
    lVar15 = 0;
    uVar25 = uVar12;
    do {
      lVar2 = uVar18 - 1;
      local_3c18.estimate = 0.0;
      lVar11 = cg->offsets[(long)pvVar16];
      local_3c18.fraction_of_vertices_seen = (double)lVar2;
      rVar4 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c18,&local_2740,
                         (param_type *)&local_3c18);
      uVar17 = rVar4 + lVar11;
      lVar8 = lVar8 + 1;
      pvVar13 = (void *)cg->nbors[uVar17];
      uVar9 = cg->offsets[(long)pvVar13 + 1] - cg->offsets[(long)pvVar13];
      uVar12 = uVar18;
      if (((uVar18 != 1) && (params->NB != false)) && (v1 == pvVar13)) {
        do {
          lVar11 = cg->offsets[(long)pvVar16];
          rVar4 = std::uniform_int_distribution<long>::operator()
                            ((uniform_int_distribution<long> *)&local_3c18,&local_2740,
                             (param_type *)&local_3c18);
          uVar17 = rVar4 + lVar11;
          lVar8 = lVar8 + 1;
          pvVar13 = (void *)cg->nbors[uVar17];
        } while (v1 == pvVar13);
        uVar9 = cg->offsets[(long)pvVar13 + 1] - cg->offsets[(long)pvVar13];
        uVar12 = uVar18;
      }
      local_3ac8._0_8_ = pvVar16;
      local_3ac8._8_8_ = pvVar13;
      local_3ab8 = uVar17;
      uStack_3ab0 = uVar12;
      if (__position._M_current == pOVar23) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338,
                   __position,(OrderedEdge *)local_3ac8);
        uVar18 = uVar9;
      }
      else {
        (__position._M_current)->index = uVar17;
        (__position._M_current)->degree = uVar12;
        (__position._M_current)->u = (VertexIdx)pvVar16;
        (__position._M_current)->v = (VertexIdx)pvVar13;
        __position._M_current = __position._M_current + 1;
        uVar18 = uVar9;
      }
      pvVar5 = (void *)((long)pvVar13 + 0x3f);
      if (-1 < (long)pvVar13) {
        pvVar5 = pvVar13;
      }
      in_stack_ffffffffffffc380
      [((long)pvVar5 >> 6) +
       ((ulong)(((ulong)pvVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           in_stack_ffffffffffffc380
           [((long)pvVar5 >> 6) +
            ((ulong)(((ulong)pvVar13 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)pvVar13 & 0x3f);
      uVar6 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar6 = uVar17;
      }
      uVar10 = uVar17 & 0xffffffff;
      in_stack_ffffffffffffc358
      [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           in_stack_ffffffffffffc358
           [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar10 & 0x3f);
      uVar17 = Escape::CGraph::getEdgeBinary(cg,(VertexIdx)v1,(VertexIdx)pvVar13);
      iVar14 = (int)uVar10;
      if (((v1 != pvVar13) && (v1 != pvVar16)) &&
         ((pvVar16 != pvVar13 && (uVar17 != 0xffffffffffffffff)))) {
        lVar11 = CONCAT71((int7)(uVar10 >> 8),params->CSS);
        if (params->CSS == true) {
          if (params->NB == true) {
            lVar11 = uVar18 - 1;
            dVar21 = 1.0 / (1.0 / (double)lVar11 +
                           1.0 / (double)lVar2 + 1.0 / (double)(long)(uVar25 - 1));
          }
          else {
            dVar21 = 1.0 / (1.0 / (double)(long)uVar18 +
                           1.0 / (double)(long)uVar12 + 1.0 / (double)(long)uVar25);
          }
        }
        else if (params->NB == true) {
          dVar21 = (double)lVar2;
        }
        else {
          dVar21 = (double)(long)uVar12;
        }
        iVar14 = (int)lVar11;
        dVar20 = dVar20 + dVar21;
      }
      if (uVar17 != 0xffffffffffffffff) {
        uVar6 = uVar17 + 0x3f;
        if (-1 < (long)uVar17) {
          uVar6 = uVar17;
        }
        iVar14 = (int)uVar17;
        in_stack_ffffffffffffc358
        [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             in_stack_ffffffffffffc358
             [((long)uVar6 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)uVar17 & 0x3f);
      }
      lVar8 = lVar8 + 1;
      lVar15 = lVar15 + 1;
      v1 = pvVar16;
      pvVar16 = pvVar13;
      uVar25 = uVar12;
    } while ((void *)lVar15 != pvVar24);
    dVar21 = (double)lVar8 * 100.0;
    in_stack_ffffffffffffc328 = uVar18;
  }
  if (params->normalization_count_available == false) {
    pPVar26 = params;
    local_3ac8._0_8_ = pvVar24;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8),
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_3aa8,(vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc358);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_3a80,(vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc380);
    local_3a58 = 0;
    local_3bf8.no_of_edges = local_3ac8._0_8_;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_3bf8.edge_list,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8));
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3bf8.visited_edge_set,&local_3aa8);
    pEVar27 = __return_storage_ptr__;
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3bf8.visited_vertex_set,&local_3a80);
    local_3bf8.no_of_query = local_3a58;
    Parameters::Parameters(&local_3b70,params);
    params_00.filename._M_string_length = (size_type)dVar20;
    params_00.filename._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc318;
    params_00.filename.field_2._M_allocated_capacity = in_stack_ffffffffffffc328;
    params_00.filename.field_2._8_8_ = dVar21;
    params_00.seed_count = (VertexIdx)pOVar22;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = &(__position._M_current)->u;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = &pOVar23->u;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar24;
    params_00.walk_length = (EdgeIdx)in_stack_ffffffffffffc358;
    params_00.subsample_size._0_4_ = in_stack_ffffffffffffc360;
    params_00.subsample_size._4_4_ = in_stack_ffffffffffffc364;
    params_00._80_8_ = in_stack_ffffffffffffc368;
    params_00.sparsification_prob._0_4_ = in_stack_ffffffffffffc370;
    params_00.sparsification_prob._4_4_ = in_stack_ffffffffffffc374;
    params_00.algo_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc378;
    params_00.algo_name._M_string_length = (size_type)in_stack_ffffffffffffc380;
    params_00.algo_name.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffc388;
    params_00.algo_name.field_2._M_allocated_capacity._4_4_ = in_stack_ffffffffffffc38c;
    params_00.algo_name.field_2._8_8_ = in_stack_ffffffffffffc390;
    params_00.out_directory._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffc398;
    params_00.out_directory._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffc39c;
    params_00.out_directory._M_string_length = (size_type)in_stack_ffffffffffffc3a0;
    params_00.out_directory.field_2._M_allocated_capacity = uVar12;
    params_00.out_directory.field_2._8_8_ = pPVar26;
    params_00._160_8_ = pEVar27;
    EstimateEdgeCount(&local_3c18,cg,&local_3bf8,params_00,iVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.out_directory._M_dataplus._M_p != &local_3b70.out_directory.field_2) {
      operator_delete(local_3b70.out_directory._M_dataplus._M_p,
                      local_3b70.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.algo_name._M_dataplus._M_p != &local_3b70.algo_name.field_2) {
      operator_delete(local_3b70.algo_name._M_dataplus._M_p,
                      local_3b70.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.filename._M_dataplus._M_p != &local_3b70.filename.field_2) {
      operator_delete(local_3b70.filename._M_dataplus._M_p,
                      local_3b70.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3bf8.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3bf8.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3bf8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3bf8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar19 = local_3c18.estimate;
    if (local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if ((void *)local_3ac8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_3ac8._8_8_,uStack_3ab0 - local_3ac8._8_8_);
    }
  }
  else {
    dVar19 = (double)cg->nEdges;
  }
  dVar20 = dVar19 * 0.5 * (1.0 / (double)(long)pvVar24) * dVar20;
  if (params->CSS == false) {
    dVar20 = dVar20 * 0.3333333333333333;
  }
  __return_storage_ptr__->fraction_of_vertices_seen = 1.0;
  __return_storage_ptr__->fraction_of_edges_seen = 1.0;
  __return_storage_ptr__->query_complexity = 1.0;
  __return_storage_ptr__->estimate = dVar20;
  dVar19 = 0.0;
  dVar20 = 0.0;
  if (in_stack_ffffffffffffc370 != 0 || in_stack_ffffffffffffc358 != in_stack_ffffffffffffc368) {
    lVar8 = 0;
    uVar17 = 0;
    puVar7 = in_stack_ffffffffffffc358;
    do {
      lVar8 = lVar8 + (ulong)((*puVar7 >> (uVar17 & 0x3f) & 1) != 0);
      iVar14 = (int)uVar17;
      puVar7 = puVar7 + (iVar14 == 0x3f);
      uVar17 = (ulong)(iVar14 + 1);
      if (iVar14 == 0x3f) {
        uVar17 = 0;
      }
    } while ((uint)uVar17 != in_stack_ffffffffffffc370 || puVar7 != in_stack_ffffffffffffc368);
    dVar20 = (double)lVar8 * 100.0;
  }
  if (in_stack_ffffffffffffc398 != 0 || in_stack_ffffffffffffc380 != in_stack_ffffffffffffc390) {
    lVar8 = 0;
    uVar17 = 0;
    puVar7 = in_stack_ffffffffffffc380;
    do {
      lVar8 = lVar8 + (ulong)((*puVar7 >> (uVar17 & 0x3f) & 1) != 0);
      iVar14 = (int)uVar17;
      puVar7 = puVar7 + (iVar14 == 0x3f);
      uVar17 = (ulong)(iVar14 + 1);
      if (iVar14 == 0x3f) {
        uVar17 = 0;
      }
    } while ((uint)uVar17 != in_stack_ffffffffffffc398 || puVar7 != in_stack_ffffffffffffc390);
    dVar19 = (double)lVar8 * 100.0;
  }
  __return_storage_ptr__->fraction_of_vertices_seen = dVar19 / (double)(long)__n;
  dVar19 = (double)(long)__n_00;
  __return_storage_ptr__->fraction_of_edges_seen = dVar20 / dVar19;
  __return_storage_ptr__->query_complexity = dVar21 / dVar19;
  if (in_stack_ffffffffffffc358 != (ulong *)0x0) {
    operator_delete(in_stack_ffffffffffffc358,
                    (long)in_stack_ffffffffffffc378 - (long)in_stack_ffffffffffffc358);
  }
  if (in_stack_ffffffffffffc380 != (ulong *)0x0) {
    operator_delete(in_stack_ffffffffffffc380,
                    (long)in_stack_ffffffffffffc3a0 - (long)in_stack_ffffffffffffc380);
  }
  if (pOVar22 != (pointer)0x0) {
    operator_delete(pOVar22,(long)pOVar23 - (long)pOVar22);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

Estimates SRW1(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables.
     * We do not really need the OrderedEdge vector for SRW.
     * However, if m is not available, and needs to be estimated based on the random walk,
     * then we need the collection of edges.
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    double X = 0; // This variable keeps a running count of the estimator
    VertexIdx v1, v2, v3, deg_of_v1, deg_of_v2, deg_of_v3;
    EdgeIdx random_nbor_edge;

    /**
     * Algorithm Initialization: Take two steps of the random walk and collect v1 and v2.
     */

    v1 = seed;
    deg_of_v1 = cg->degree(v1); // degree of parent vertex
    if (deg_of_v1 == 0)  // If we are stuck with an isolate vertex, we change the seed
        v1 = AlternateSeed(cg,mt);
    deg_of_v1 = cg->degree(v1);
    std::uniform_int_distribution<VertexIdx> dist_parent(0, deg_of_v1 - 1);
    no_of_query++; // One query to the uniform random neighbor oracle
    random_nbor_edge = cg->offsets[v1] + dist_parent(mt); // TODO: check randomness. same seeding ok?
    v2 = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
    deg_of_v2 = cg->degree(v2);// degree of the child vertex

    /**
    * Update data structures
    */
    edge_list.push_back(OrderedEdge{v1, v2, random_nbor_edge, deg_of_v1}); // Note that we do not care of the ordering of the edge.
    visited_vertex_set[v1] = true;
    visited_vertex_set[v2] = true;
    visited_edge_set[random_nbor_edge] = true;


    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the vertex v2
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_v2 - 1); // v2 is the current last visited vertex on the random walk
        random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
        deg_of_v3 = cg->degree(v3);// degree of the vertex v3

        /**
         * The parameter NB decides if the random walk is non-backtracking.
         * If it is true, then v1-v2-v1 becomes an invalid state.
         * We sample another random neighbor in that case.
         * Also, in final estimation, d'(u)=d(u)-1 is used.
         */
        if (params.NB and deg_of_v2!= 1) { // if v_2 is singleton, then only one option
            while (v1 == v3) { // We reached an invalid state, resample.
                random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
                deg_of_v3 = cg->degree(v3);// degree of the vertex v3
            }
        }

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{v2, v3, random_nbor_edge, deg_of_v2}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[v3] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Check if v1, v2 and v3 forms a triangle
         * Note that (v1,v2) and (v2,v3) edges are present.
         * So we check if (v1,v3) edge is present and if all v1,v2 and v3 are distinct
         */
        EdgeIdx e = cg->getEdgeBinary(v1,v3);
        no_of_query++; // One query to the edge query oracle
        if (e!= -1 && v1!=v2 && v2!=v3 && v1!=v3) {
            if (params.CSS && params.NB) {  // Both CSS and NB are true
                double denom = (1.0 / (deg_of_v1-1)) +
                                (1.0 /(deg_of_v2-1)) +
                                (1.0 /(deg_of_v3-1));
                X += 1.0 / denom;
            }
            else if (params.CSS){ // Only CSS is true
                double denom = (1.0 / deg_of_v1) + (1.0 /deg_of_v2) + (1.0 /deg_of_v3);
                X += 1.0 / denom;
            }
            else if (params.NB) // Only NB is true
                X+= deg_of_v2 - 1;
            else                // Both CSS and NB are false
                X += deg_of_v2;


        }

        /**
         * Update data structures
         */
        if (e!= -1)
            visited_edge_set[e] =true;
        /**
         * slide the window of history!
         */
        v1 = v2;
        deg_of_v1 = deg_of_v2;
        v2 = v3;
        deg_of_v2 = deg_of_v3;
    }

    double edge_estimate = 0.0;
    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /**
     * Estimate the number of triangles.
     */
    double triangleEstimate = 0.0;
    if (params.CSS)
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate / 2.0) ; // Note that m is actually twice the number of edges
    else
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate/2.0) * (1/ 3.0) ; // Note that m is actually twice the number of edges

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query * 100.0 /m;

    return return_estimate;
}